

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

void __thiscall cmLBDepend::GenerateDependInformation(cmLBDepend *this,cmDependInformation *info)

{
  pointer pbVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  cmSourceFile *pcVar5;
  string *psVar6;
  pointer pbVar7;
  char *filename;
  const_iterator __begin3;
  allocator<char> local_91;
  char *local_90;
  string *local_88;
  cmSourceFile *local_80;
  pointer local_78;
  string incpath;
  string local_50;
  
  if (info->DependDone == false) {
    info->DependDone = true;
    filename = (info->FullPath)._M_dataplus._M_p;
    if (filename == (char *)0x0) {
      cmSystemTools::Error
                ("Attempt to find dependencies for file without path!",(char *)0x0,(char *)0x0,
                 (char *)0x0);
      return;
    }
    bVar2 = cmsys::SystemTools::FileExists(filename,true);
    if (bVar2) {
      DependWalk(this,info);
    }
    pcVar5 = info->SourceFile;
    if (pcVar5 != (cmSourceFile *)0x0) {
      pbVar7 = (pcVar5->Depends).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (pcVar5->Depends).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar7 != pbVar1) {
        for (; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
          AddDependency(this,info,(pbVar7->_M_dataplus)._M_p);
        }
        return;
      }
    }
    if (!bVar2) {
      this_00 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,filename,&local_91);
      cmsys::SystemTools::GetFilenameWithoutExtension(&incpath,&local_50);
      pcVar5 = cmMakefile::GetSource(this_00,&incpath,Ambiguous);
      std::__cxx11::string::~string((string *)&incpath);
      std::__cxx11::string::~string((string *)&local_50);
      if (pcVar5 != (cmSourceFile *)0x0) {
        psVar6 = cmSourceFile::GetFullPath(pcVar5,(string *)0x0);
        bVar3 = std::operator==(psVar6,filename);
        if (bVar3) {
          return;
        }
        local_88 = (string *)&info->FullPath;
        local_78 = (this->IncludeDirectories).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        local_90 = filename;
        local_80 = pcVar5;
        for (pbVar7 = (this->IncludeDirectories).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; filename = local_90,
            pbVar7 != local_78; pbVar7 = pbVar7 + 1) {
          std::__cxx11::string::string((string *)&incpath,(string *)pbVar7);
          if ((incpath._M_string_length != 0) &&
             (incpath._M_dataplus._M_p[incpath._M_string_length - 1] != '/')) {
            std::operator+(&local_50,&incpath,"/");
            std::__cxx11::string::operator=((string *)&incpath,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          std::operator+(&local_50,&incpath,local_90);
          std::__cxx11::string::operator=((string *)&incpath,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          psVar6 = cmSourceFile::GetFullPath(local_80,(string *)0x0);
          _Var4 = std::operator==(psVar6,&incpath);
          if (_Var4) {
            bVar2 = true;
            std::__cxx11::string::_M_assign(local_88);
          }
          std::__cxx11::string::~string((string *)&incpath);
        }
      }
    }
    if (!bVar2) {
      bVar2 = cmsys::RegularExpression::find
                        (&this->ComplainFileRegularExpression,&info->IncludeName);
      if (bVar2) {
        cmSystemTools::Error("error cannot find dependencies for ",filename,(char *)0x0,(char *)0x0)
        ;
      }
      else {
        (info->FullPath)._M_string_length = 0;
        *(info->FullPath)._M_dataplus._M_p = '\0';
      }
    }
  }
  return;
}

Assistant:

void GenerateDependInformation(cmDependInformation* info)
  {
    // If dependencies are already done, stop now.
    if (info->DependDone) {
      return;
    }
    // Make sure we don't visit the same file more than once.
    info->DependDone = true;

    const char* path = info->FullPath.c_str();
    if (!path) {
      cmSystemTools::Error(
        "Attempt to find dependencies for file without path!");
      return;
    }

    bool found = false;

    // If the file exists, use it to find dependency information.
    if (cmSystemTools::FileExists(path, true)) {
      // Use the real file to find its dependencies.
      this->DependWalk(info);
      found = true;
    }

    // See if the cmSourceFile for it has any files specified as
    // dependency hints.
    if (info->SourceFile != nullptr) {

      // Get the cmSourceFile corresponding to this.
      const cmSourceFile& cFile = *(info->SourceFile);
      // See if there are any hints for finding dependencies for the missing
      // file.
      if (!cFile.GetDepends().empty()) {
        // Dependency hints have been given.  Use them to begin the
        // recursion.
        for (std::string const& file : cFile.GetDepends()) {
          this->AddDependency(info, file.c_str());
        }

        // Found dependency information.  We are done.
        found = true;
      }
    }

    if (!found) {
      // Try to find the file amongst the sources
      cmSourceFile* srcFile = this->Makefile->GetSource(
        cmSystemTools::GetFilenameWithoutExtension(path));
      if (srcFile) {
        if (srcFile->GetFullPath() == path) {
          found = true;
        } else {
          // try to guess which include path to use
          for (std::string incpath : this->IncludeDirectories) {
            if (!incpath.empty() && incpath.back() != '/') {
              incpath = incpath + "/";
            }
            incpath = incpath + path;
            if (srcFile->GetFullPath() == incpath) {
              // set the path to the guessed path
              info->FullPath = incpath;
              found = true;
            }
          }
        }
      }
    }

    if (!found) {
      // Couldn't find any dependency information.
      if (this->ComplainFileRegularExpression.find(info->IncludeName)) {
        cmSystemTools::Error("error cannot find dependencies for ", path);
      } else {
        // Destroy the name of the file so that it won't be output as a
        // dependency.
        info->FullPath.clear();
      }
    }
  }